

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scan.h
# Opt level: O2

OLECHAR __thiscall
UTF8EncodingPolicyBase<false>::ReadSurrogatePairUpper
          (UTF8EncodingPolicyBase<false> *this,EncodedCharPtr *p,EncodedCharPtr last)

{
  byte bVar1;
  byte *pbVar2;
  code *pcVar3;
  bool bVar4;
  OLECHAR OVar5;
  undefined4 *puVar6;
  OLECHAR ch;
  
  pbVar2 = *p;
  *p = pbVar2 + 1;
  if (pbVar2 < last) {
    bVar1 = *pbVar2;
    ch = (OLECHAR)bVar1;
    OVar5 = (ushort)bVar1;
    if ((char)bVar1 < '\0') goto LAB_00d5595d;
  }
  else {
    OVar5 = L'\0';
  }
  ch = OVar5;
  AssertCount = AssertCount + 1;
  Js::Throw::LogAssert();
  puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
  *puVar6 = 1;
  bVar4 = Js::Throw::ReportAssert
                    ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Scan.h"
                     ,0xea,"(IsMultiUnitChar(ch))","IsMultiUnitChar(ch)");
  if (!bVar4) {
    pcVar3 = (code *)invalidInstructionException();
    (*pcVar3)();
  }
  *puVar6 = 0;
LAB_00d5595d:
  *(undefined1 *)&this->m_decodeOptions = (char)this->m_decodeOptions | doSecondSurrogatePair;
  OVar5 = ReadRest<true>(this,ch,p,last);
  return OVar5;
}

Assistant:

OLECHAR ReadSurrogatePairUpper(EncodedCharPtr &p, EncodedCharPtr last)
    {
        EncodedChar ch = (nullTerminated || p < last) ? *p++ : (p++, 0);
        Assert(IsMultiUnitChar(ch));
        this->m_decodeOptions |= utf8::DecodeOptions::doSecondSurrogatePair;
        return ReadRest<true>(ch, p, last);
    }